

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ApiColumnSize(Fts5Context *pCtx,int iCol,int *pnToken)

{
  Fts5Config *pConfig;
  int iVar1;
  i64 iRowid;
  int i;
  int iVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  int n;
  char *z;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)pCtx;
  pConfig = *(Fts5Config **)(lVar3 + 0x18);
  iVar1 = 0;
  if (((byte)pCtx[0x50] & 4) != 0) {
    if (pConfig->bColumnsize == 0) {
      if ((pConfig->zContent == (char *)0x0) || (pConfig->eContent == 3)) {
        iVar1 = 0;
        for (lVar3 = 0; lVar3 < pConfig->nCol; lVar3 = lVar3 + 1) {
          if (pConfig->abUnindexed[lVar3] == '\0') {
            *(undefined4 *)(*(long *)(pCtx + 0x10) + lVar3 * 4) = 0xffffffff;
          }
        }
      }
      else {
        lVar4 = 0;
        iVar1 = fts5SeekCursor((Fts5Cursor *)pCtx,0);
        lVar3 = 0;
        while (iVar1 == 0) {
          if (pConfig->nCol <= lVar3) {
            iVar1 = 0;
            break;
          }
          iVar1 = 0;
          if (pConfig->abUnindexed[lVar3] == '\0') {
            z = (char *)0x0;
            n = 0;
            *(undefined4 *)(*(long *)(pCtx + 0x10) + lVar4) = 0;
            iVar1 = fts5TextFromStmt(pConfig,*(sqlite3_stmt **)(pCtx + 0x38),(int)lVar3,&z,&n);
            if (iVar1 == 0) {
              iVar1 = sqlite3Fts5Tokenize(pConfig,8,z,n,(void *)(*(long *)(pCtx + 0x10) + lVar4),
                                          fts5ColumnSizeCb);
            }
            (pConfig->t).pLocale = (char *)0x0;
            (pConfig->t).nLocale = 0;
          }
          lVar3 = lVar3 + 1;
          lVar4 = lVar4 + 4;
        }
      }
    }
    else {
      iRowid = fts5CursorRowid((Fts5Cursor *)pCtx);
      iVar1 = sqlite3Fts5StorageDocsize
                        (*(Fts5Storage **)(lVar3 + 0x28),iRowid,*(int **)(pCtx + 0x10));
    }
    pCtx[0x50] = (Fts5Context)((byte)pCtx[0x50] & 0xfb);
  }
  if (iCol < 0) {
    *pnToken = 0;
    iVar2 = 0;
    for (lVar3 = 0; lVar3 < pConfig->nCol; lVar3 = lVar3 + 1) {
      iVar2 = iVar2 + *(int *)(*(long *)(pCtx + 0x10) + lVar3 * 4);
      *pnToken = iVar2;
    }
  }
  else {
    if (iCol < pConfig->nCol) {
      iVar2 = *(int *)(*(long *)(pCtx + 0x10) + (ulong)(uint)iCol * 4);
    }
    else {
      iVar1 = 0x19;
      iVar2 = 0;
    }
    *pnToken = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5ApiColumnSize(Fts5Context *pCtx, int iCol, int *pnToken){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  int rc = SQLITE_OK;

  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_DOCSIZE) ){
    if( pConfig->bColumnsize ){
      i64 iRowid = fts5CursorRowid(pCsr);
      rc = sqlite3Fts5StorageDocsize(pTab->pStorage, iRowid, pCsr->aColumnSize);
    }else if( !pConfig->zContent || pConfig->eContent==FTS5_CONTENT_UNINDEXED ){
      int i;
      for(i=0; i<pConfig->nCol; i++){
        if( pConfig->abUnindexed[i]==0 ){
          pCsr->aColumnSize[i] = -1;
        }
      }
    }else{
      int i;
      rc = fts5SeekCursor(pCsr, 0);
      for(i=0; rc==SQLITE_OK && i<pConfig->nCol; i++){
        if( pConfig->abUnindexed[i]==0 ){
          const char *z = 0;
          int n = 0;
          pCsr->aColumnSize[i] = 0;
          rc = fts5TextFromStmt(pConfig, pCsr->pStmt, i, &z, &n);
          if( rc==SQLITE_OK ){
            rc = sqlite3Fts5Tokenize(pConfig, FTS5_TOKENIZE_AUX,
                z, n, (void*)&pCsr->aColumnSize[i], fts5ColumnSizeCb
            );
          }
          sqlite3Fts5ClearLocale(pConfig);
        }
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_DOCSIZE);
  }
  if( iCol<0 ){
    int i;
    *pnToken = 0;
    for(i=0; i<pConfig->nCol; i++){
      *pnToken += pCsr->aColumnSize[i];
    }
  }else if( iCol<pConfig->nCol ){
    *pnToken = pCsr->aColumnSize[iCol];
  }else{
    *pnToken = 0;
    rc = SQLITE_RANGE;
  }
  return rc;
}